

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixFullPathname(sqlite3_vfs *pVfs,char *zPath,int nOut,char *zOut)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  char *__src;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  stat buf;
  undefined1 local_c0 [24];
  uint local_a8;
  
  iVar2 = 1;
  __src = (char *)0x0;
  do {
    iVar3 = (*aSyscall[0x1b].pCurrent)(zPath,local_c0);
    if (iVar3 == 0) {
      bVar14 = (local_a8 & 0xf000) != 0xa000;
      iVar3 = 0;
    }
    else {
      puVar4 = (uint *)__errno_location();
      bVar14 = true;
      iVar3 = 0;
      if (*puVar4 != 2) {
        iVar3 = 0xe;
        sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x8e7d,
                    "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
        pcVar10 = zPath;
        if (zPath == (char *)0x0) {
          pcVar10 = "";
        }
        sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",0x8e7d,(ulong)*puVar4,"lstat",pcVar10,"");
      }
    }
    pcVar10 = zPath;
    pcVar9 = zPath;
    if (!bVar14) {
      if (__src == (char *)0x0) {
        __src = (char *)sqlite3_malloc(nOut);
        iVar8 = iVar2;
        if (__src == (char *)0x0) {
          iVar3 = 7;
        }
      }
      else {
        iVar8 = iVar2 + 1;
        if (99 < iVar2) {
          iVar3 = 0xe;
          sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x8e88,
                      "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
        }
      }
      pcVar10 = __src;
      pcVar9 = zOut;
      iVar2 = iVar8;
      if (iVar3 == 0) {
        uVar11 = (*aSyscall[0x1a].pCurrent)(zPath,__src,(long)(nOut + -1));
        if ((int)uVar11 < 0) {
          iVar3 = 0xe;
          sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x8e8e,
                      "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
          puVar4 = (uint *)__errno_location();
          if (zPath == (char *)0x0) {
            zPath = "";
          }
          sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",0x8e8e,(ulong)*puVar4,"readlink",zPath,""
                     );
        }
        else {
          iVar3 = 0;
          if (*__src != '/') {
            if (zPath == (char *)0x0) {
              uVar5 = 0;
            }
            else {
              sVar6 = strlen(zPath);
              uVar5 = (ulong)((uint)sVar6 & 0x3fffffff);
            }
            do {
              if ((long)uVar5 < 1) {
                sVar6 = 0;
                goto LAB_001eecb0;
              }
              uVar1 = uVar5 - 1;
              lVar7 = uVar5 - 1;
              uVar5 = uVar1;
            } while (zPath[lVar7] != '/');
            sVar6 = (size_t)((int)uVar1 + 1);
LAB_001eecb0:
            uVar13 = (int)sVar6 + uVar11;
            if ((int)uVar13 < nOut) {
              memmove(__src + sVar6,__src,(ulong)(uVar11 + 1));
              memcpy(__src,zPath,sVar6);
              iVar3 = 0;
              uVar11 = uVar13;
            }
            else {
              iVar3 = 0xe;
              sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x8e94,
                          "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
            }
          }
          __src[uVar11] = '\0';
        }
      }
    }
    if (iVar3 == 0) {
      if (pcVar10 == zOut) {
        iVar3 = 0;
      }
      else {
        uVar13 = 0;
        uVar11 = 0;
        if (pcVar10 != (char *)0x0) {
          sVar6 = strlen(pcVar10);
          uVar11 = (uint)sVar6 & 0x3fffffff;
        }
        if (*pcVar10 != '/') {
          lVar7 = (*aSyscall[3].pCurrent)(zOut,(long)(nOut + -2));
          if (lVar7 == 0) {
            iVar3 = 0xe;
            sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x8e44,
                        "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
            puVar4 = (uint *)__errno_location();
            sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",0x8e44,(ulong)*puVar4,"getcwd",pcVar10,
                        "");
            goto LAB_001eed27;
          }
          if (zOut == (char *)0x0) {
            uVar12 = 0;
          }
          else {
            sVar6 = strlen(zOut);
            uVar12 = (uint)sVar6 & 0x3fffffff;
          }
          uVar13 = uVar12 + 1;
          zOut[uVar12] = '/';
        }
        if ((int)(uVar11 + uVar13) < nOut) {
          iVar3 = 0;
          sqlite3_snprintf(nOut - uVar13,zOut + uVar13,"%s");
        }
        else {
          zOut[uVar13] = '\0';
          iVar3 = 0xe;
          sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x8e4d,
                      "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
        }
      }
    }
LAB_001eed27:
    zPath = pcVar9;
    if (!(bool)(~bVar14 & iVar3 == 0)) {
      sqlite3_free(__src);
      return iVar3;
    }
  } while( true );
}

Assistant:

static int unixFullPathname(
  sqlite3_vfs *pVfs,            /* Pointer to vfs object */
  const char *zPath,            /* Possibly relative input path */
  int nOut,                     /* Size of output buffer in bytes */
  char *zOut                    /* Output buffer */
){
#if !defined(HAVE_READLINK) || !defined(HAVE_LSTAT)
  return mkFullPathname(zPath, zOut, nOut);
#else
  int rc = SQLITE_OK;
  int nByte;
  int nLink = 1;                /* Number of symbolic links followed so far */
  const char *zIn = zPath;      /* Input path for each iteration of loop */
  char *zDel = 0;

  assert( pVfs->mxPathname==MAX_PATHNAME );
  UNUSED_PARAMETER(pVfs);

  /* It's odd to simulate an io-error here, but really this is just
  ** using the io-error infrastructure to test that SQLite handles this
  ** function failing. This function could fail if, for example, the
  ** current working directory has been unlinked.
  */
  SimulateIOError( return SQLITE_ERROR );

  do {

    /* Call stat() on path zIn. Set bLink to true if the path is a symbolic
    ** link, or false otherwise.  */
    int bLink = 0;
    struct stat buf;
    if( osLstat(zIn, &buf)!=0 ){
      if( errno!=ENOENT ){
        rc = unixLogError(SQLITE_CANTOPEN_BKPT, "lstat", zIn);
      }
    }else{
      bLink = S_ISLNK(buf.st_mode);
    }

    if( bLink ){
      if( zDel==0 ){
        zDel = sqlite3_malloc(nOut);
        if( zDel==0 ) rc = SQLITE_NOMEM_BKPT;
      }else if( ++nLink>SQLITE_MAX_SYMLINKS ){
        rc = SQLITE_CANTOPEN_BKPT;
      }

      if( rc==SQLITE_OK ){
        nByte = osReadlink(zIn, zDel, nOut-1);
        if( nByte<0 ){
          rc = unixLogError(SQLITE_CANTOPEN_BKPT, "readlink", zIn);
        }else{
          if( zDel[0]!='/' ){
            int n;
            for(n = sqlite3Strlen30(zIn); n>0 && zIn[n-1]!='/'; n--);
            if( nByte+n+1>nOut ){
              rc = SQLITE_CANTOPEN_BKPT;
            }else{
              memmove(&zDel[n], zDel, nByte+1);
              memcpy(zDel, zIn, n);
              nByte += n;
            }
          }
          zDel[nByte] = '\0';
        }
      }

      zIn = zDel;
    }

    assert( rc!=SQLITE_OK || zIn!=zOut || zIn[0]=='/' );
    if( rc==SQLITE_OK && zIn!=zOut ){
      rc = mkFullPathname(zIn, zOut, nOut);
    }
    if( bLink==0 ) break;
    zIn = zOut;
  }while( rc==SQLITE_OK );

  sqlite3_free(zDel);
  return rc;
#endif   /* HAVE_READLINK && HAVE_LSTAT */
}